

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vs_wrapper.hpp
# Opt level: O2

void VSInterface::RegisterFilter<TMedian>(VSRegisterFunction registerFunc,VSPlugin *vsplugin)

{
  TMedian filter;
  string local_d8;
  TMedian local_b8;
  
  TMedian::TMedian(&local_b8);
  Filter::VSParams_abi_cxx11_(&local_d8,&local_b8.super_Filter);
  (*registerFunc)("TemporalMedian",local_d8._M_dataplus._M_p,Create<TMedian>,(void *)0x0,vsplugin);
  std::__cxx11::string::~string((string *)&local_d8);
  return;
}

Assistant:

void RegisterFilter(VSRegisterFunction registerFunc, VSPlugin* vsplugin) {
    FilterType filter;
    registerFunc(filter.VSName(), filter.VSParams().c_str(), Create<FilterType>, nullptr, vsplugin);
  }